

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void PathBezierToCasteljau
               (ImVector<ImVec2> *path,float x1,float y1,float x2,float y2,float x3,float y3,
               float x4,float y4,float tess_tol,int level)

{
  int *piVar1;
  int iVar2;
  ImVec2 *pIVar3;
  ImGuiContext *pIVar4;
  ImVec2 *pIVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  while( true ) {
    pIVar4 = GImGui;
    fVar10 = x4 - x1;
    fVar11 = y4 - y1;
    fVar12 = (x2 - x4) * fVar11 - (y2 - y4) * fVar10;
    fVar13 = (x3 - x4) * fVar11 - (y3 - y4) * fVar10;
    uVar8 = -(uint)(-fVar12 <= fVar12);
    uVar9 = -(uint)(-fVar13 <= fVar13);
    fVar12 = (float)(~uVar9 & (uint)-fVar13 | (uint)fVar13 & uVar9) +
             (float)(~uVar8 & (uint)-fVar12 | (uint)fVar12 & uVar8);
    if (fVar12 * fVar12 < (fVar10 * fVar10 + fVar11 * fVar11) * tess_tol) {
      iVar2 = path->Capacity;
      if (path->Size == iVar2) {
        iVar7 = path->Size + 1;
        if (iVar2 == 0) {
          iVar6 = 8;
        }
        else {
          iVar6 = iVar2 / 2 + iVar2;
        }
        if (iVar7 < iVar6) {
          iVar7 = iVar6;
        }
        if (iVar2 < iVar7) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + 1;
          pIVar5 = (ImVec2 *)(*(pIVar4->IO).MemAllocFn)((long)iVar7 << 3);
          if (path->Data != (ImVec2 *)0x0) {
            memcpy(pIVar5,path->Data,(long)path->Size << 3);
          }
          pIVar3 = path->Data;
          if (pIVar3 != (ImVec2 *)0x0) {
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + -1;
          }
          (*(GImGui->IO).MemFreeFn)(pIVar3);
          path->Data = pIVar5;
          path->Capacity = iVar7;
        }
      }
      pIVar5 = path->Data;
      iVar2 = path->Size;
      path->Size = iVar2 + 1;
      pIVar5[iVar2].x = x4;
      pIVar5[iVar2].y = y4;
      return;
    }
    if (9 < level) break;
    fVar10 = (x1 + x2) * 0.5;
    fVar11 = (y1 + y2) * 0.5;
    fVar15 = (x2 + x3) * 0.5;
    fVar14 = (y2 + y3) * 0.5;
    x3 = (x3 + x4) * 0.5;
    y3 = (y3 + y4) * 0.5;
    fVar12 = (fVar10 + fVar15) * 0.5;
    fVar13 = (fVar11 + fVar14) * 0.5;
    x2 = (fVar15 + x3) * 0.5;
    y2 = (fVar14 + y3) * 0.5;
    fVar14 = (fVar12 + x2) * 0.5;
    fVar15 = (fVar13 + y2) * 0.5;
    level = level + 1;
    PathBezierToCasteljau(path,x1,y1,fVar10,fVar11,fVar12,fVar13,fVar14,fVar15,tess_tol,level);
    x1 = fVar14;
    y1 = fVar15;
  }
  return;
}

Assistant:

static void PathBezierToCasteljau(ImVector<ImVec2>* path, float x1, float y1, float x2, float y2, float x3, float y3, float x4, float y4, float tess_tol, int level)
{
    float dx = x4 - x1;
    float dy = y4 - y1;
    float d2 = ((x2 - x4) * dy - (y2 - y4) * dx);
    float d3 = ((x3 - x4) * dy - (y3 - y4) * dx);
    d2 = (d2 >= 0) ? d2 : -d2;
    d3 = (d3 >= 0) ? d3 : -d3;
    if ((d2+d3) * (d2+d3) < tess_tol * (dx*dx + dy*dy))
    {
        path->push_back(ImVec2(x4, y4));
    }
    else if (level < 10)
    {
        float x12 = (x1+x2)*0.5f,       y12 = (y1+y2)*0.5f;
        float x23 = (x2+x3)*0.5f,       y23 = (y2+y3)*0.5f;
        float x34 = (x3+x4)*0.5f,       y34 = (y3+y4)*0.5f;
        float x123 = (x12+x23)*0.5f,    y123 = (y12+y23)*0.5f;
        float x234 = (x23+x34)*0.5f,    y234 = (y23+y34)*0.5f;
        float x1234 = (x123+x234)*0.5f, y1234 = (y123+y234)*0.5f;

        PathBezierToCasteljau(path, x1,y1,        x12,y12,    x123,y123,  x1234,y1234, tess_tol, level+1);
        PathBezierToCasteljau(path, x1234,y1234,  x234,y234,  x34,y34,    x4,y4,       tess_tol, level+1);
    }
}